

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

EmitInfo __thiscall
Wasm::WasmBytecodeGenerator::EmitUnaryExpr
          (WasmBytecodeGenerator *this,OpCodeAsmJs op,WasmType *signature)

{
  WasmType type;
  WasmRegisterSpace *this_00;
  EmitInfo EVar1;
  EmitInfo local_30;
  EmitInfo info;
  
  type = *signature;
  local_30 = PopEvalStack(this,signature[1],(char16 *)0x0);
  ReleaseLocation(this,&local_30);
  if (type == Void) {
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)op,0,(ulong)local_30 & 0xffffffff);
    EVar1.super_EmitInfoBase.location = 0xffffffff;
    EVar1.type = Void;
  }
  else {
    this_00 = GetRegisterSpace(this,type);
    EVar1.super_EmitInfoBase.location = WAsmJs::RegisterSpace::AcquireTmpRegister(this_00);
    (*this->m_writer->_vptr_IWasmByteCodeWriter[0xf])
              (this->m_writer,(ulong)op,(ulong)EVar1.super_EmitInfoBase.location,
               (ulong)local_30 & 0xffffffff);
    EVar1.type = type;
  }
  return EVar1;
}

Assistant:

EmitInfo WasmBytecodeGenerator::EmitUnaryExpr(Js::OpCodeAsmJs op, const WasmTypes::WasmType* signature)
{
    WasmTypes::WasmType resultType = signature[0];
    WasmTypes::WasmType inputType = signature[1];

    EmitInfo info = PopEvalStack(inputType);

    ReleaseLocation(&info);
    if (resultType == WasmTypes::Void)
    {
        m_writer->AsmReg2(op, 0, info.location);
        return EmitInfo();
    }

    Js::RegSlot resultReg = GetRegisterSpace(resultType)->AcquireTmpRegister();

    m_writer->AsmReg2(op, resultReg, info.location);

    return EmitInfo(resultReg, resultType);
}